

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptBitsDel(poptBits bits,char *s)

{
  ulong uVar1;
  uint uVar2;
  size_t local_40;
  uint32_t ix;
  uint32_t h;
  uint32_t h1;
  uint32_t h0;
  size_t ns;
  char *s_local;
  poptBits bits_local;
  
  ns = (size_t)s;
  s_local = (char *)bits;
  if (s == (char *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = strlen(s);
  }
  _h1 = local_40;
  h = 0;
  ix = 0;
  if ((s_local == (char *)0x0) || (local_40 == 0)) {
    bits_local._4_4_ = -0x14;
  }
  else {
    poptJlu32lpair((void *)ns,local_40,&h,&ix);
    for (_h1 = 0; _h1 < _poptBitsK; _h1 = _h1 + 1) {
      uVar2 = (h + (int)_h1 * ix) % _poptBitsM;
      uVar1 = (ulong)(uVar2 >> 5);
      *(uint *)(s_local + uVar1 * 4) =
           (1 << ((byte)uVar2 & 0x1f) ^ 0xffffffffU) & *(uint *)(s_local + uVar1 * 4);
    }
    bits_local._4_4_ = 0;
  }
  return bits_local._4_4_;
}

Assistant:

int poptBitsDel(poptBits bits, const char * s)
{
    size_t ns = (s ? strlen(s) : 0);
    uint32_t h0 = 0;
    uint32_t h1 = 0;

    if (bits == NULL || ns == 0)
	return POPT_ERROR_NULLARG;

    poptJlu32lpair(s, ns, &h0, &h1);

    for (ns = 0; ns < (size_t)_poptBitsK; ns++) {
        uint32_t h = h0 + ns * h1;
        uint32_t ix = (h % _poptBitsM);
        PBM_CLR(ix, bits);
    }
    return 0;
}